

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

void __thiscall
pbrt::GeometricPrimitive::GeometricPrimitive
          (GeometricPrimitive *this,Shape *shape,Material *material,Light *areaLight,
          MediumInterface *mediumInterface,FloatTexture *alpha)

{
  MediumInterface *in_RDX;
  long *in_FS_OFFSET;
  MediumInterface *in_stack_ffffffffffffffa8;
  
  Shape::Shape((Shape *)in_RDX,(Shape *)in_stack_ffffffffffffffa8);
  Material::Material((Material *)in_RDX,(Material *)in_stack_ffffffffffffffa8);
  Light::Light((Light *)in_RDX,(Light *)in_stack_ffffffffffffffa8);
  MediumInterface::MediumInterface(in_RDX,in_stack_ffffffffffffffa8);
  FloatTexture::FloatTexture((FloatTexture *)in_RDX,(FloatTexture *)in_stack_ffffffffffffffa8);
  *(long *)(*in_FS_OFFSET + -0xd8) = *(long *)(*in_FS_OFFSET + -0xd8) + 0x30;
  return;
}

Assistant:

GeometricPrimitive::GeometricPrimitive(Shape shape, Material material, Light areaLight,
                                       const MediumInterface &mediumInterface,
                                       FloatTexture alpha)
    : shape(shape),
      material(material),
      areaLight(areaLight),
      mediumInterface(mediumInterface),
      alpha(alpha) {
    primitiveMemory += sizeof(*this);
}